

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

void do_note_off(_mdi *mdi,_event_data *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  _note (*paa_Var5) [16] [128];
  int iVar6;
  uint uVar7;
  
  bVar1 = data->channel;
  uVar7 = data->data >> 8;
  paa_Var5 = mdi->note_table;
  if (mdi->note_table[0][bVar1][uVar7].active == '\0') {
    paa_Var5 = mdi->note_table + 1;
  }
  if ((*(char *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x2e) == '\0') ||
     ((bVar2 = *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x2c),
      mdi->channel[bVar1].isdrum != '\0' && ((bVar2 & 4) == 0)))) {
    return;
  }
  if (((bVar2 & 0x40) != 0) && (*(char *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x24) == '\0')) {
    *(undefined1 *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x48) = 1;
    return;
  }
  *(undefined1 *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x48) = 0;
  bVar2 = *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x2c);
  if ((bVar2 & 0x40) == 0) {
    if ((bVar2 & 4) != 0) {
      *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x2c) = bVar2 & 0xbb;
    }
    *(undefined4 *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x20) = 0;
    return;
  }
  bVar3 = *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x2d);
  if (bVar3 != 0) {
    *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x2d) = bVar3 | 2;
    return;
  }
  if ((bVar2 & 0x20) == 0) {
    bVar3 = *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x24);
    if ((char)bVar2 < '\0') {
      if (4 < bVar3) {
        return;
      }
      *(undefined1 *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x24) = 5;
      lVar4 = *(long *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x10);
      iVar6 = *(int *)(lVar4 + 0x38);
      if (*(int *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x28) <= *(int *)(lVar4 + 0x54))
      goto LAB_0036268d;
    }
    else {
      if (3 < bVar3) {
        return;
      }
      *(undefined1 *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x24) = 4;
      lVar4 = *(long *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x10);
      iVar6 = *(int *)(lVar4 + 0x34);
      if (*(int *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x28) <= *(int *)(lVar4 + 0x50))
      goto LAB_0036268d;
    }
  }
  else {
    if (2 < *(byte *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x24)) {
      return;
    }
    *(undefined1 *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x24) = 3;
    lVar4 = *(long *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x10);
    iVar6 = *(int *)(lVar4 + 0x30);
    if (*(int *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x28) <= *(int *)(lVar4 + 0x4c))
    goto LAB_0036268d;
  }
  iVar6 = -iVar6;
LAB_0036268d:
  *(int *)((long)((*paa_Var5)[bVar1] + uVar7) + 0x20) = iVar6;
  return;
}

Assistant:

static void do_note_off(struct _mdi *mdi, struct _event_data *data) {
	struct _note *nte;
	unsigned char ch = data->channel;

	MIDI_EVENT_DEBUG(__FUNCTION__,ch);

	nte = &mdi->note_table[0][ch][(data->data >> 8)];
	if (!nte->active)
		nte = &mdi->note_table[1][ch][(data->data >> 8)];
	if (!nte->active) {
		return;
	}

	if ((mdi->channel[ch].isdrum) && (!(nte->modes & SAMPLE_LOOP))) {
		return;
	}

	if ((nte->modes & SAMPLE_ENVELOPE) && (nte->env == 0)) {
		// This is a fix for notes that end before the
		// initial step of the envelope has completed
		// making it impossible to hear them at times.
		nte->is_off = 1;
	} else {
		do_note_off_extra(nte);
	}
}